

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void codeReal(Vdbe *v,char *z,int negateFlag,int iMem)

{
  int length;
  u8 *in_R9;
  long in_FS_OFFSET;
  double value;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (z != (char *)0x0) {
    value = -NAN;
    length = sqlite3Strlen30(z);
    sqlite3AtoF(z,&value,length,'\x01');
    if (negateFlag != 0) {
      value = -value;
    }
    sqlite3VdbeAddOp4Dup8(v,0x9a,iMem,(int)&value,-0xc,in_R9,value._0_4_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void codeReal(Vdbe *v, const char *z, int negateFlag, int iMem){
  if( ALWAYS(z!=0) ){
    double value;
    sqlite3AtoF(z, &value, sqlite3Strlen30(z), SQLITE_UTF8);
    assert( !sqlite3IsNaN(value) ); /* The new AtoF never returns NaN */
    if( negateFlag ) value = -value;
    sqlite3VdbeAddOp4Dup8(v, OP_Real, 0, iMem, 0, (u8*)&value, P4_REAL);
  }
}